

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int changeTempStorage(Parse *pParse,char *zStorageType)

{
  byte bVar1;
  sqlite3 *psVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  
  bVar3 = *zStorageType - 0x30;
  if (2 < bVar3) {
    iVar4 = sqlite3StrICmp(zStorageType,"file");
    if (iVar4 == 0) {
      bVar3 = 1;
    }
    else {
      iVar4 = sqlite3StrICmp(zStorageType,"memory");
      bVar3 = (iVar4 == 0) * '\x02';
    }
  }
  psVar2 = pParse->db;
  bVar1 = psVar2->temp_store;
  uVar5 = (uint)bVar1;
  if ((bVar3 != bVar1) && (uVar5 = invalidateTempStorage(pParse), uVar5 == 0)) {
    psVar2->temp_store = bVar3;
  }
  return uVar5;
}

Assistant:

static int changeTempStorage(Parse *pParse, const char *zStorageType){
  int ts = getTempStore(zStorageType);
  sqlite3 *db = pParse->db;
  if( db->temp_store==ts ) return SQLITE_OK;
  if( invalidateTempStorage( pParse ) != SQLITE_OK ){
    return SQLITE_ERROR;
  }
  db->temp_store = (u8)ts;
  return SQLITE_OK;
}